

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_codec_err_t aom_codec_get_stream_info(aom_codec_ctx_t *ctx,aom_codec_stream_info_t *si)

{
  aom_codec_get_si_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  aom_codec_stream_info_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_codec_err_t res;
  aom_codec_err_t local_14;
  
  if ((in_RDI == (aom_codec_ctx_t *)0x0) || (in_RSI == (aom_codec_stream_info_t *)0x0)) {
    local_14 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI->iface == (aom_codec_iface_t *)0x0) || (in_RDI->priv == (aom_codec_priv_t *)0x0))
  {
    local_14 = AOM_CODEC_ERROR;
  }
  else {
    in_RSI->w = 0;
    in_RSI->h = 0;
    p_Var1 = (in_RDI->iface->dec).get_si;
    paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
    local_14 = (*p_Var1)(paVar2,in_RSI);
  }
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    in_RDI->err = local_14;
  }
  return local_14;
}

Assistant:

aom_codec_err_t aom_codec_get_stream_info(aom_codec_ctx_t *ctx,
                                          aom_codec_stream_info_t *si) {
  aom_codec_err_t res;

  if (!ctx || !si) {
    res = AOM_CODEC_INVALID_PARAM;
  } else if (!ctx->iface || !ctx->priv) {
    res = AOM_CODEC_ERROR;
  } else {
    /* Set default/unknown values */
    si->w = 0;
    si->h = 0;

    res = ctx->iface->dec.get_si(get_alg_priv(ctx), si);
  }

  return SAVE_STATUS(ctx, res);
}